

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BacktrackingTokenStream.h
# Opt level: O0

StdGrammarToken * __thiscall
SGParser::BacktrackingTokenStream<SGParser::Generator::StdGrammarToken>::GetNextToken
          (BacktrackingTokenStream<SGParser::Generator::StdGrammarToken> *this,
          StdGrammarToken *token)

{
  StreamBlock *this_00;
  StreamBlock *newBlock;
  string asStack_50 [32];
  size_t local_30;
  size_t local_28;
  BacktrackingTokenStream<SGParser::Generator::StdGrammarToken> *local_20;
  StdGrammarToken *token_local;
  BacktrackingTokenStream<SGParser::Generator::StdGrammarToken> *this_local;
  
  local_20 = (BacktrackingTokenStream<SGParser::Generator::StdGrammarToken> *)token;
  token_local = (StdGrammarToken *)this;
  if (this->ThisPos != 0x200) {
    if (this->LengthLeft == 0) {
      TokenCode::TokenCode((TokenCode *)&newBlock,1);
      std::__cxx11::string::string(asStack_50);
      local_30 = 0;
      local_28 = 0;
      Generator::StdGrammarToken::operator=
                ((StdGrammarToken *)local_20,(StdGrammarToken *)&newBlock);
      Generator::StdGrammarToken::~StdGrammarToken((StdGrammarToken *)&newBlock);
      this_local = local_20;
    }
    else if (this->ThisPos < this->pThisBlock->Count) {
      Generator::StdGrammarToken::operator=(token,this->pThisBlock->Tokens + this->ThisPos);
      this->ThisPos = this->ThisPos + 1;
      if (this->ThisPos == 0x200) {
        this->ThisPos = 0;
        this->pThisBlock = this->pThisBlock->pNext;
      }
      this_local = local_20;
    }
    else {
      (*this->pSourceStream->_vptr_TokenStream[2])(this->pSourceStream,token);
      Generator::StdGrammarToken::operator=
                (this->pThisBlock->Tokens + this->ThisPos,(StdGrammarToken *)local_20);
      if ((this->SourceEOFFlag & 1U) == 0) {
        if (*(CodeType *)
             &(local_20->super_TokenStream<SGParser::Generator::StdGrammarToken>)._vptr_TokenStream
            == 1) {
          this->SourceEOFFlag = true;
        }
        this->ThisPos = this->ThisPos + 1;
        this->pThisBlock->Count = this->pThisBlock->Count + 1;
        this->Pos = this->Pos + 1;
        if (this->ThisPos == 0x200) {
          this_00 = (StreamBlock *)operator_new(0x7018);
          StreamBlock::StreamBlock(this_00);
          this->ThisPos = 0;
          this->pThisBlock->pNext = this_00;
          this->pThisBlock = this->pThisBlock->pNext;
          this->pThisBlock->Index = this->Pos;
          ReleaseExtraBuffers(this);
        }
        this_local = local_20;
      }
      else {
        this_local = local_20;
      }
    }
    return (StdGrammarToken *)this_local;
  }
  __assert_fail("ThisPos != StreamBlock::BufferSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/Parser/./BacktrackingTokenStream.h"
                ,0x14d,
                "virtual Token &SGParser::BacktrackingTokenStream<SGParser::Generator::StdGrammarToken>::GetNextToken(Token &) [Token = SGParser::Generator::StdGrammarToken]"
               );
}

Assistant:

Token& BacktrackingTokenStream<Token>::GetNextToken(Token& token) {
    // Check if we are in the correct state, i.e.
    // there is a StreamBlock to save the next token
    SG_ASSERT(ThisPos != StreamBlock::BufferSize);

    // Zero length - return EOF Token
    if (LengthLeft == 0u) {
        token = Token{};
        return token;
    }

    // If we are behind the end (backtracked)
    // return next consecutive token
    if (ThisPos < pThisBlock->Count) {
        token = pThisBlock->Tokens[ThisPos];
        ++ThisPos;
        if (ThisPos == StreamBlock::BufferSize) {
            ThisPos    = 0u;
            pThisBlock = pThisBlock->pNext;
        }
        return token;
    }

    // Read next token from original stream
    pSourceStream->GetNextToken(token);
    pThisBlock->Tokens[ThisPos] = token;

    // If source ended earlier, just return EOF value
    if (SourceEOFFlag)
        return token;
    if (token.Code == TokenCode::TokenEOF)
        SourceEOFFlag = true;

    // Increase pointer
    ++ThisPos;
    ++pThisBlock->Count;
    // Final position in stream
    ++Pos;
    if (ThisPos == StreamBlock::BufferSize) {
        // Enforce basic exception safety
        // If new StreamBlock fails then ThisPos will stay equal
        // to StreamBlock::BufferSize and next call to GetNextToken
        // will fail (but BacktrackingTokenStream will stay in safe-to-delete state)
        const auto newBlock = new StreamBlock;
        ThisPos             = 0u;
        pThisBlock->pNext   = newBlock;
        pThisBlock          = pThisBlock->pNext;
        pThisBlock->Index   = Pos;
        // Check for freeing any extra buffers
        ReleaseExtraBuffers();
    }
    return token;
}